

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functional.cpp
# Opt level: O2

void __thiscall Functional::make_k(Functional *this,int k)

{
  Field::operator=(&(this->kmean_search).f,&this->f);
  (this->kmean_search).points_nmb =
       (int)(((long)(this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18);
  (this->kmean_search).k = k;
  Kmean::k_mean(&this->kmean_search);
  std::
  vector<std::vector<Cluster,_std::allocator<Cluster>_>,_std::allocator<std::vector<Cluster,_std::allocator<Cluster>_>_>_>
  ::push_back(&this->searches,&(this->kmean_search).clusters);
  return;
}

Assistant:

void Functional::make_k(int k) {

    kmean_search.f = f;
    kmean_search.points_nmb = (int) f.all_points.size();
    kmean_search.k = k;
    kmean_search.k_mean();
    searches.push_back(kmean_search.clusters);

}